

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal-multiple-loops.c
# Opt level: O1

void loop_creating_worker(void *context)

{
  int iVar1;
  undefined1 *__ptr;
  undefined8 extraout_RAX;
  uint uVar2;
  undefined1 *puVar3;
  undefined8 in_R9;
  uv_signal_t signal;
  undefined1 auStack_5e0 [152];
  undefined1 auStack_548 [152];
  undefined1 auStack_4b0 [152];
  undefined1 auStack_418 [848];
  undefined1 *puStack_c8;
  undefined1 auStack_b8 [152];
  
  while( true ) {
    puVar3 = (undefined1 *)0x350;
    __ptr = (undefined1 *)malloc(0x350);
    if (__ptr == (undefined1 *)0x0) break;
    puVar3 = __ptr;
    iVar1 = uv_loop_init();
    if (iVar1 != 0) goto LAB_0016b02a;
    puVar3 = __ptr;
    iVar1 = uv_signal_init(__ptr,auStack_b8);
    if (iVar1 != 0) goto LAB_0016b025;
    puVar3 = auStack_b8;
    iVar1 = uv_signal_start(auStack_b8,signal_unexpected_cb,0xf);
    if (iVar1 != 0) goto LAB_0016b020;
    uv_close(auStack_b8,0);
    puVar3 = __ptr;
    iVar1 = uv_run(__ptr,0);
    if (iVar1 != 0) goto LAB_0016b01b;
    uv_loop_close(__ptr);
    free(__ptr);
    uv_mutex_lock(&counter_lock);
    loop_creation_counter = loop_creation_counter + 1;
    uv_mutex_unlock(&counter_lock);
    if (stop != 0) {
      return;
    }
  }
  loop_creating_worker_cold_5();
LAB_0016b01b:
  loop_creating_worker_cold_4();
LAB_0016b020:
  loop_creating_worker_cold_3();
LAB_0016b025:
  loop_creating_worker_cold_2();
LAB_0016b02a:
  loop_creating_worker_cold_1();
  puStack_c8 = auStack_b8;
  iVar1 = uv_loop_init(auStack_418);
  if (iVar1 == 0) {
    if (((ulong)puVar3 & 0xfffffffd) == 0) {
      iVar1 = uv_signal_init(auStack_418,auStack_4b0);
      if (iVar1 != 0) goto LAB_0016b23f;
      iVar1 = uv_signal_start(auStack_4b0,signal1_cb,10);
      if (iVar1 != 0) goto LAB_0016b244;
      iVar1 = uv_signal_init(auStack_418,auStack_548);
      if (iVar1 != 0) goto LAB_0016b249;
      iVar1 = uv_signal_start(auStack_548,signal1_cb,10);
      if (iVar1 == 0) goto LAB_0016b0d4;
      goto LAB_0016b24e;
    }
LAB_0016b0d4:
    uVar2 = (int)puVar3 - 1;
    if (uVar2 < 2) {
      iVar1 = uv_signal_init(auStack_418,auStack_5e0);
      if (iVar1 != 0) goto LAB_0016b230;
      iVar1 = uv_signal_start(auStack_5e0,signal2_cb,0xc);
      if (iVar1 == 0) goto LAB_0016b110;
      goto LAB_0016b235;
    }
LAB_0016b110:
    uv_sem_post(&sem);
    iVar1 = uv_run(auStack_418,0);
    if (iVar1 != 0) goto LAB_0016b221;
    if (((ulong)puVar3 & 0xfffffffd) != 0) {
LAB_0016b17d:
      if (1 < uVar2) {
LAB_0016b19e:
        uv_sem_post(&sem);
        iVar1 = uv_run(auStack_418,0);
        if (iVar1 != 0) goto LAB_0016b226;
        if (((ulong)puVar3 & 0xfffffffd) == 0) {
          uv_close(auStack_4b0,0);
          uv_close(auStack_548,0);
        }
        if (uVar2 < 2) {
          uv_close(auStack_5e0,0);
        }
        iVar1 = uv_run(auStack_418,0);
        if (iVar1 == 0) {
          uv_loop_close(auStack_418);
          return;
        }
        goto LAB_0016b22b;
      }
      iVar1 = uv_signal_start(auStack_5e0,signal2_cb,0xc);
      if (iVar1 == 0) goto LAB_0016b19e;
      goto LAB_0016b23a;
    }
    iVar1 = uv_signal_start(auStack_4b0,signal1_cb,10);
    if (iVar1 == 0) {
      iVar1 = uv_signal_start(auStack_548,signal1_cb,10);
      if (iVar1 != 0) goto LAB_0016b258;
      goto LAB_0016b17d;
    }
  }
  else {
    signal_handling_worker_cold_1();
LAB_0016b221:
    signal_handling_worker_cold_8();
LAB_0016b226:
    signal_handling_worker_cold_12();
LAB_0016b22b:
    signal_handling_worker_cold_13();
LAB_0016b230:
    signal_handling_worker_cold_6();
LAB_0016b235:
    signal_handling_worker_cold_7();
LAB_0016b23a:
    signal_handling_worker_cold_11();
LAB_0016b23f:
    signal_handling_worker_cold_2();
LAB_0016b244:
    signal_handling_worker_cold_3();
LAB_0016b249:
    signal_handling_worker_cold_4();
LAB_0016b24e:
    signal_handling_worker_cold_5();
  }
  signal_handling_worker_cold_9();
LAB_0016b258:
  signal_handling_worker_cold_10();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-signal-multiple-loops.c"
          ,0xa0,"0 && \"signal_unexpected_cb should never be called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

static void loop_creating_worker(void* context) {
  (void) context;

  do {
    uv_loop_t *loop;
    uv_signal_t signal;
    int r;

    loop = malloc(sizeof(*loop));
    ASSERT(loop != NULL);
    ASSERT(0 == uv_loop_init(loop));

    r = uv_signal_init(loop, &signal);
    ASSERT(r == 0);

    r = uv_signal_start(&signal, signal_unexpected_cb, SIGTERM);
    ASSERT(r == 0);

    uv_close((uv_handle_t*) &signal, NULL);

    r = uv_run(loop, UV_RUN_DEFAULT);
    ASSERT(r == 0);

    uv_loop_close(loop);
    free(loop);

    increment_counter(&loop_creation_counter);
  } while (!stop);
}